

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lambertian.h
# Opt level: O0

RGBColor __thiscall
pm::Lambertian::sampleF(Lambertian *this,ShadeRecord *sr,Vector3 *wo,Vector3 *wi,float *pdf)

{
  float *in_R9;
  float fVar1;
  RGBColor RVar2;
  pm local_bc [12];
  pm local_b0 [12];
  pm local_a4 [12];
  Vector3 local_98;
  Vector3 local_8c;
  Vector3 local_80;
  float local_74;
  float local_70;
  Vector3 sp;
  Vector3 u;
  undefined1 local_50 [8];
  Vector3 v;
  Vector3 w;
  float *pdf_local;
  Vector3 *wi_local;
  Vector3 *wo_local;
  ShadeRecord *sr_local;
  Lambertian *this_local;
  
  Vector3::Vector3((Vector3 *)&v.y,(Vector3 *)&wo[3].y);
  Vector3::Vector3((Vector3 *)&u.y,0.0034,1.0,0.0071);
  cross((pm *)local_50,(Vector3 *)&u.y,(Vector3 *)&v.y);
  Vector3::normalize((Vector3 *)local_50);
  cross((pm *)&sp.y,(Vector3 *)local_50,(Vector3 *)&v.y);
  SamplerState::sampleHemisphere((SamplerState *)&local_74);
  operator*((pm *)&local_98,local_74,(Vector3 *)&sp.y);
  operator*(local_a4,local_70,(Vector3 *)local_50);
  Vector3::operator+(&local_8c,&local_98);
  operator*(local_b0,sp.x,(Vector3 *)&v.y);
  Vector3::operator+(&local_80,&local_8c);
  Vector3::operator=((Vector3 *)pdf,&local_80);
  Vector3::normalize((Vector3 *)pdf);
  fVar1 = dot((Vector3 *)&wo[3].y,(Vector3 *)pdf);
  *in_R9 = fVar1 * 0.31830987;
  operator*(local_bc,(sr->localHitPoint).y,(RGBColor *)&(sr->localHitPoint).z);
  RVar2 = RGBColor::operator*((RGBColor *)this,0.31830987);
  return RVar2;
}

Assistant:

inline RGBColor Lambertian::sampleF(const ShadeRecord &sr, const Vector3 &wo, Vector3 &wi, float &pdf) const
{
	const Vector3 w = sr.normal;
	// jitter the up vector in case normal is vertical
	Vector3 v = cross(Vector3(0.0034f, 1.0f, 0.0071f), w);
	v.normalize();
	const Vector3 u = cross(v, w);

	const Vector3 sp = samplerState_.sampleHemisphere();
	wi = sp.x * u + sp.y * v + sp.z * w;
	wi.normalize();

	pdf = dot(sr.normal, wi) * invPi;

	return (kd_ * cd_ * invPi);
}